

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::labelled_statement::labelled_statement
          (labelled_statement *this,source_extend *extend,wstring *id,statement_ptr *s)

{
  byte bVar1;
  bool bVar2;
  statement_ptr *s_local;
  wstring *id_local;
  source_extend *extend_local;
  labelled_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__labelled_statement_00296980;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr(&this->s_,s);
  bVar1 = std::__cxx11::wstring::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!id_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x32c,
                  "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
                 );
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->s_);
  if (!bVar2) {
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x32d,
                  "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit labelled_statement(const source_extend& extend, const std::wstring& id, statement_ptr&& s) : statement(extend), id_(id), s_(std::move(s)) {
        assert(!id_.empty());
        assert(s_);
    }